

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall glslang::HlslGrammar::acceptCompilationUnit(HlslGrammar *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TIntermAggregate *pTVar3;
  HlslGrammar *this_local;
  
  bVar1 = acceptDeclarationList(this,&this->unitNode);
  if (bVar1) {
    bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokNone);
    if (bVar1) {
      if (this->unitNode != (TIntermNode *)0x0) {
        iVar2 = (*this->unitNode->_vptr_TIntermNode[6])();
        if (CONCAT44(extraout_var,iVar2) == 0) {
          pTVar3 = TIntermediate::growAggregate
                             (this->intermediate,(TIntermNode *)0x0,this->unitNode);
          this->unitNode = (TIntermNode *)pTVar3;
        }
      }
      TIntermediate::setTreeRoot(this->intermediate,this->unitNode);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::acceptCompilationUnit()
{
    if (! acceptDeclarationList(unitNode))
        return false;

    if (! peekTokenClass(EHTokNone))
        return false;

    // set root of AST
    if (unitNode && !unitNode->getAsAggregate())
        unitNode = intermediate.growAggregate(nullptr, unitNode);
    intermediate.setTreeRoot(unitNode);

    return true;
}